

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O3

TestLog * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,EndSampleToken *param_1)

{
  int *piVar1;
  
  TestLog::startSample(*(TestLog **)this);
  for (piVar1 = *(int **)(this + 8); piVar1 != *(int **)(this + 0x10); piVar1 = piVar1 + 4) {
    if (*piVar1 == 0) {
      TestLog::writeSampleValue(*(TestLog **)this,*(deInt64 *)(piVar1 + 2));
    }
    else if (*piVar1 == 1) {
      TestLog::writeSampleValue(*(TestLog **)this,*(double *)(piVar1 + 2));
    }
  }
  TestLog::endSample(*(TestLog **)this);
  return *(TestLog **)this;
}

Assistant:

TestLog& SampleBuilder::operator<< (const TestLog::EndSampleToken&)
{
	m_log->startSample();

	for (std::vector<Value>::const_iterator val = m_values.begin(); val != m_values.end(); ++val)
	{
		if (val->type == Value::TYPE_FLOAT64)
			m_log->writeSampleValue(val->value.float64);
		else if (val->type == Value::TYPE_INT64)
			m_log->writeSampleValue(val->value.int64);
		else
			DE_ASSERT(false);
	}

	m_log->endSample();

	return *m_log;
}